

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

string * __thiscall
cmInstallExportGenerator::TempDirCalculate_abi_cxx11_
          (string *__return_storage_ptr__,cmInstallExportGenerator *this)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_30 [32];
  
  psVar1 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  local_30._8_8_ = (psVar1->_M_dataplus)._M_p;
  local_30._0_8_ = psVar1->_M_string_length;
  local_30._16_8_ = 0x12;
  local_30._24_8_ = "/CMakeFiles/Export";
  views._M_len = 2;
  views._M_array = (iterator)local_30;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    cmSystemTools::ComputeStringMD5
              ((string *)local_30,&(this->super_cmInstallGenerator).Destination);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_30._0_8_);
    if ((undefined1 *)local_30._0_8_ != local_30 + 0x10) {
      operator_delete((void *)local_30._0_8_,local_30._16_8_ + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallExportGenerator::TempDirCalculate() const
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  std::string path = cmStrCat(
    this->LocalGenerator->GetCurrentBinaryDirectory(), "/CMakeFiles/Export");
  if (this->Destination.empty()) {
    return path;
  }

#ifndef CMAKE_BOOTSTRAP
  path += '/';
  // Replace the destination path with a hash to keep it short.
  path += cmSystemTools::ComputeStringMD5(this->Destination);
#endif

  return path;
}